

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<double>(String *__return_storage_ptr__,double *params)

{
  double *value;
  CappedArray<char,_32UL> *params_00;
  CappedArray<char,_32UL> local_40;
  double *local_18;
  double *params_local;
  
  local_18 = params;
  params_local = (double *)__return_storage_ptr__;
  value = fwd<double>(params);
  toCharSequence<double>(&local_40,value);
  _::concat<kj::CappedArray<char,32ul>>(__return_storage_ptr__,(_ *)&local_40,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}